

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int av1_use_hash_me(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  undefined1 local_9;
  
  local_9 = false;
  if (((*(byte *)(in_RDI + 0x3c16f) & 1) != 0) &&
     (local_9 = false, (*(byte *)(in_RDI + 0x3c170) & 1) != 0)) {
    iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
    local_9 = iVar1 != 0;
  }
  return (int)local_9;
}

Assistant:

static inline int av1_use_hash_me(const AV1_COMP *const cpi) {
  return (cpi->common.features.allow_screen_content_tools &&
          cpi->common.features.allow_intrabc &&
          frame_is_intra_only(&cpi->common));
}